

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

void __thiscall
vkt::sparse::anon_unknown_0::Renderer::draw
          (Renderer *this,DeviceInterface *vk,VkDevice device,VkQueue queue,Delegate *drawDelegate)

{
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  VkResult result;
  VkCommandBuffer_s **ppVVar5;
  Handle<(vk::HandleType)17> *pHVar6;
  Handle<(vk::HandleType)23> *pHVar7;
  Handle<(vk::HandleType)18> *pHVar8;
  Handle<(vk::HandleType)16> *pHVar9;
  Handle<(vk::HandleType)9> *pHVar10;
  Move<vk::VkCommandBuffer_s_*> *this_00;
  IVec2 *this_01;
  VkOffset3D VVar11;
  VkExtent3D VVar12;
  undefined4 local_188 [2];
  VkBufferMemoryBarrier barriers_1 [1];
  deInt32 local_140;
  deInt32 dStack_13c;
  deUint32 local_138;
  deUint32 local_130;
  deUint32 dStack_12c;
  deInt32 local_128;
  undefined8 local_120;
  VkBufferImageCopy region;
  VkImageMemoryBarrier barriers [1];
  undefined4 local_90 [2];
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkRect2D renderArea;
  VkClearValue clearValue;
  Delegate *drawDelegate_local;
  VkQueue queue_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  Renderer *this_local;
  
  this_00 = &this->m_cmdBuffer;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  beginCommandBuffer(vk,*ppVVar5);
  join_0x00000010_0x00000000_ = ::vk::makeClearValueColor(&this->m_clearColor);
  renderPassBeginInfo.pClearValues = (VkClearValue *)::vk::makeOffset2D(0,0);
  this_01 = &this->m_renderSize;
  dVar3 = tcu::Vector<int,_2>::x(this_01);
  dVar4 = tcu::Vector<int,_2>::y(this_01);
  renderArea.offset = (VkOffset2D)::vk::makeExtent2D(dVar3,dVar4);
  local_90[0] = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  renderPassBeginInfo.pNext = (void *)pHVar6->m_internal;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                     (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  renderPassBeginInfo.renderPass.m_internal = pHVar7->m_internal;
  renderPassBeginInfo.framebuffer.m_internal = (deUint64)renderPassBeginInfo.pClearValues;
  renderPassBeginInfo.renderArea.offset = renderArea.offset;
  renderPassBeginInfo.renderArea.extent.width = 1;
  renderPassBeginInfo._48_8_ = &renderArea.extent;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk->_vptr_DeviceInterface[0x74])(vk,*ppVVar5,local_90,0);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar5;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,pVVar1,0,pHVar8->m_internal);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  dVar2 = pHVar9->m_internal;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*drawDelegate->_vptr_Delegate[2])(drawDelegate,dVar2,*ppVVar5);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk->_vptr_DeviceInterface[0x76])(vk,*ppVVar5);
  region.imageExtent.height = 0x2d;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
            (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,*ppVVar5,0x400,0x1000,0,0,0,0,0,1,&region.imageExtent.height);
  local_120 = 0;
  region.bufferOffset._0_4_ = 0;
  region.bufferOffset._4_4_ = 0;
  region._8_16_ = ::vk::makeImageSubresourceLayers(1,0,0,1);
  VVar11 = ::vk::makeOffset3D(0,0,0);
  local_128 = VVar11.z;
  region.imageOffset.x = local_128;
  _local_130 = VVar11._0_8_;
  region.imageSubresource.baseArrayLayer = local_130;
  region.imageSubresource.layerCount = dStack_12c;
  dVar3 = tcu::Vector<int,_2>::x(this_01);
  dVar4 = tcu::Vector<int,_2>::y(this_01);
  VVar12 = ::vk::makeExtent3D(dVar3,dVar4,1);
  _local_140 = VVar12._0_8_;
  region.imageOffset.y = local_140;
  region.imageOffset.z = dStack_13c;
  local_138 = VVar12.depth;
  region.imageExtent.width = local_138;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar5;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  barriers_1[0].size = (this->m_colorBuffer).m_internal;
  (*vk->_vptr_DeviceInterface[99])(vk,pVVar1,pHVar10->m_internal,6,barriers_1[0].size,1,&local_120);
  local_188[0] = 0x2c;
  barriers_1[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barriers_1[0]._4_4_ = 0;
  barriers_1[0].pNext._0_4_ = 0x1000;
  barriers_1[0].pNext._4_4_ = 0x2000;
  barriers_1[0].srcAccessMask = 0xffffffff;
  barriers_1[0].dstAccessMask = 0xffffffff;
  barriers_1[0]._24_8_ = (this->m_colorBuffer).m_internal;
  barriers_1[0].buffer.m_internal = 0;
  barriers_1[0].offset = 0xffffffffffffffff;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,*ppVVar5,0x1000,0x4000,0,0,0,1,local_188,0,0);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,*ppVVar5);
  ::vk::checkResult(result,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferTests.cpp"
                    ,0x29c);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  submitCommandsAndWait
            (vk,device,queue,*ppVVar5,0,(VkSemaphore *)0x0,(VkPipelineStageFlags *)0x0,0,
             (VkSemaphore *)0x0);
  return;
}

Assistant:

void draw (const DeviceInterface&	vk,
			   const VkDevice			device,
			   const VkQueue			queue,
			   const Delegate&			drawDelegate) const
	{
		beginCommandBuffer(vk, *m_cmdBuffer);

		const VkClearValue			clearValue	= makeClearValueColor(m_clearColor);
		const VkRect2D				renderArea	=
		{
			makeOffset2D(0, 0),
			makeExtent2D(m_renderSize.x(), m_renderSize.y()),
		};
		const VkRenderPassBeginInfo renderPassBeginInfo =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
			DE_NULL,										// const void*             pNext;
			*m_renderPass,									// VkRenderPass            renderPass;
			*m_framebuffer,									// VkFramebuffer           framebuffer;
			renderArea,										// VkRect2D                renderArea;
			1u,												// uint32_t                clearValueCount;
			&clearValue,									// const VkClearValue*     pClearValues;
		};
		vk.cmdBeginRenderPass(*m_cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

		vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
		drawDelegate.rendererDraw(*m_pipelineLayout, *m_cmdBuffer);

		vk.cmdEndRenderPass(*m_cmdBuffer);

		// Prepare color image for copy
		{
			const VkImageMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,						// VkStructureType			sType;
					DE_NULL,													// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,						// VkAccessFlags			outputMask;
					VK_ACCESS_TRANSFER_READ_BIT,								// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					destQueueFamilyIndex;
					*m_colorImage,												// VkImage					image;
					m_colorSubresourceRange,									// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}
		// Color image -> host buffer
		{
			const VkBufferImageCopy region =
			{
				0ull,																		// VkDeviceSize                bufferOffset;
				0u,																			// uint32_t                    bufferRowLength;
				0u,																			// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u),			// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),														// VkOffset3D                  imageOffset;
				makeExtent3D(m_renderSize.x(), m_renderSize.y(), 1u),						// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*m_cmdBuffer, *m_colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, m_colorBuffer, 1u, &region);
		}
		// Buffer write barrier
		{
			const VkBufferMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType    sType;
					DE_NULL,										// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,						// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           dstQueueFamilyIndex;
					m_colorBuffer,									// VkBuffer           buffer;
					0ull,											// VkDeviceSize       offset;
					VK_WHOLE_SIZE,									// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, DE_NULL, 0u);
		}

		VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *m_cmdBuffer);
	}